

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O3

int ffpkns(fitsfile *fptr,char *keyroot,int nstart,int nkey,char **value,char **comm,int *status)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  char tcomment [73];
  char keyname [75];
  char local_d8 [80];
  char local_88 [88];
  
  iVar6 = *status;
  if (iVar6 < 1) {
    if (comm == (char **)0x0) {
      local_d8[0] = '\0';
LAB_001b3208:
      bVar2 = false;
    }
    else {
      pcVar4 = *comm;
      sVar3 = strlen(pcVar4);
      bVar2 = true;
      if (0 < (int)(uint)sVar3) {
        uVar7 = (ulong)((uint)sVar3 & 0x7fffffff);
        do {
          if (pcVar4[uVar7 - 1] != ' ') {
            if (pcVar4[uVar7 - 1] == '&') {
              uVar5 = 0x49;
              if ((uint)uVar7 < 0x49) {
                uVar5 = (uint)uVar7;
              }
              local_d8[0] = '\0';
              strncat(local_d8,pcVar4,(ulong)(uVar5 - 1));
              goto LAB_001b3208;
            }
            break;
          }
          bVar1 = 1 < (long)uVar7;
          uVar7 = uVar7 - 1;
        } while (bVar1);
      }
    }
    if (0 < nkey) {
      uVar7 = 0;
      do {
        ffkeyn(keyroot,nstart + (int)uVar7,local_88,status);
        if (bVar2) {
          pcVar4 = comm[uVar7];
        }
        else {
          pcVar4 = local_d8;
        }
        ffpkys(fptr,local_88,value[uVar7],pcVar4,status);
        iVar6 = *status;
      } while ((iVar6 < 1) && (uVar7 = uVar7 + 1, (uint)nkey != uVar7));
    }
  }
  return iVar6;
}

Assistant:

int ffpkns( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyroot,      /* I - root name of keywords to write       */
            int  nstart,        /* I - starting index number                */
            int  nkey,          /* I - number of keywords to write          */
            char *value[],      /* I - array of pointers to keyword values  */
            char *comm[],       /* I - array of pointers to keyword comment */
            int  *status)       /* IO - error status                        */
/*
  Write (put) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NKEY -1) inclusive.  Writes string keywords.
  The value strings will be truncated at 68 characters, and the HEASARC
  long string keyword convention is not supported by this routine.
*/
{
    char keyname[FLEN_KEYWORD], tcomment[FLEN_COMMENT];
    int ii, jj, repeat, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check if first comment string is to be repeated for all the keywords */
    /* by looking to see if the last non-blank character is a '&' char      */

    repeat = 0;

    if (comm)
    {
      len = strlen(comm[0]);

      while (len > 0  && comm[0][len - 1] == ' ')
        len--;                               /* ignore trailing blanks */

      if (len > 0 && comm[0][len - 1] == '&')
      {
        len = minvalue(len, FLEN_COMMENT);
        tcomment[0] = '\0';
        strncat(tcomment, comm[0], len-1); /* don't copy the final '&' char */
        repeat = 1;
      }
    }
    else
    {
      repeat = 1;
      tcomment[0] = '\0';
    }

    for (ii=0, jj=nstart; ii < nkey; ii++, jj++)
    {
        ffkeyn(keyroot, jj, keyname, status);
        if (repeat)
            ffpkys(fptr, keyname, value[ii], tcomment, status);
        else
            ffpkys(fptr, keyname, value[ii], comm[ii], status);

        if (*status > 0)
            return(*status);
    }
    return(*status);
}